

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int coda_rinex_cursor_set_product(coda_cursor *cursor,coda_product *product)

{
  coda_product *product_local;
  coda_cursor *cursor_local;
  
  cursor->product = product;
  cursor->n = 1;
  cursor->stack[0].type = product->root_type;
  cursor->stack[0].index = -1;
  cursor->stack[0].bit_offset = -1;
  return 0;
}

Assistant:

int coda_rinex_cursor_set_product(coda_cursor *cursor, coda_product *product)
{
    cursor->product = product;
    cursor->n = 1;
    cursor->stack[0].type = product->root_type;
    cursor->stack[0].index = -1;        /* there is no index for the root of the product */
    cursor->stack[0].bit_offset = -1;   /* not applicable for memory backend */

    return 0;
}